

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O1

void tb_flush_jmp_cache_aarch64(CPUState *cpu,target_ulong addr)

{
  uc_struct_conflict7 *puVar1;
  TargetPageBits *pTVar2;
  byte bVar3;
  ulong uVar4;
  
  puVar1 = cpu->uc;
  pTVar2 = puVar1->init_target_page;
  uVar4 = addr - (long)-pTVar2->mask;
  bVar3 = (char)pTVar2->bits - 6;
  memset(cpu->tb_jmp_cache + ((uint)((uVar4 >> (bVar3 & 0x3f) ^ uVar4) >> (bVar3 & 0x3f)) & 0xfc0),0
         ,0x200);
  bVar3 = (char)puVar1->init_target_page->bits - 6;
  memset(cpu->tb_jmp_cache + ((uint)((addr >> (bVar3 & 0x3f) ^ addr) >> (bVar3 & 0x3f)) & 0xfc0),0,
         0x200);
  return;
}

Assistant:

void tb_flush_jmp_cache(CPUState *cpu, target_ulong addr)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif

    /* Discard jump cache entries for any tb which might potentially
       overlap the flushed page.  */
    tb_jmp_cache_clear_page(cpu, addr - TARGET_PAGE_SIZE);
    tb_jmp_cache_clear_page(cpu, addr);
}